

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void continuous_dist_test_integrate_pdf<trng::extreme_value_dist<float>>
               (extreme_value_dist<float> *d)

{
  float fVar1;
  int i;
  int iVar2;
  float fVar3;
  float fVar4;
  value_type vVar5;
  float fVar6;
  result_type tol;
  vector<float,_std::allocator<float>_> y;
  AssertionHandler catchAssertionHandler;
  undefined4 local_fc;
  vector<float,_std::allocator<float>_> local_f8;
  undefined1 local_d8 [16];
  float local_bc;
  AssertionHandler local_b8;
  SourceLineInfo local_70;
  ITransientExpression local_60;
  float *local_50;
  char *local_48;
  size_t sStack_40;
  undefined4 *local_38;
  StringRef local_30;
  
  fVar1 = (d->P).theta_;
  fVar3 = (d->P).eta_;
  fVar6 = fVar1 * -4.60015 + fVar3;
  local_d8 = ZEXT416((uint)(((fVar1 * 1.5271798 + fVar3) - fVar6) / 2896.0));
  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  iVar2 = 0;
  do {
    fVar1 = (d->P).theta_;
    fVar3 = (((float)iVar2 * (float)local_d8._0_4_ + fVar6) - (d->P).eta_) / fVar1;
    fVar4 = expf(fVar3);
    local_b8.m_assertionInfo.macroName.m_start._0_4_ = expf(fVar3 - fVar4);
    local_b8.m_assertionInfo.macroName.m_start._0_4_ =
         local_b8.m_assertionInfo.macroName.m_start._0_4_ / fVar1;
    if (local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,(float *)&local_b8);
    }
    else {
      *local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_b8.m_assertionInfo.macroName.m_start._0_4_;
      local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0xb51);
  vVar5 = simpson_int<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                     local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                     local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  local_fc = 0x37000701;
  local_60._vptr_ITransientExpression = (_func_int **)0x2a6457;
  local_60.m_isBinaryExpression = true;
  local_60.m_result = false;
  local_60._10_6_ = 0;
  local_70.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_70.line = 0x94;
  Catch::StringRef::StringRef(&local_30,"std::abs(s - result_type(98) / result_type(100)) < tol");
  Catch::AssertionHandler::AssertionHandler
            (&local_b8,(StringRef *)&local_60,&local_70,local_30,Normal);
  local_bc = ABS((float)local_d8._0_4_ * vVar5 + -0.98);
  local_d8._0_8_ = CONCAT44(local_d8._4_4_,local_bc) & 0x7fffffffffffffff;
  local_d8._8_4_ = local_d8._8_4_ & 0x7fffffff;
  local_d8._12_4_ = local_d8._12_4_ & 0x7fffffff;
  Catch::StringRef::StringRef((StringRef *)&local_70,"<");
  local_60.m_result = (float)local_d8._0_4_ < 7.631025e-06;
  local_60.m_isBinaryExpression = true;
  local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_003182b8;
  local_48 = local_70.file;
  sStack_40 = local_70.line;
  local_38 = &local_fc;
  local_50 = &local_bc;
  Catch::AssertionHandler::handleExpr(&local_b8,&local_60);
  Catch::ITransientExpression::~ITransientExpression(&local_60);
  Catch::AssertionHandler::complete(&local_b8);
  if (local_b8.m_completed == false) {
    (*(local_b8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if (local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void continuous_dist_test_integrate_pdf(const dist &d) {
  using result_type = typename dist::result_type;
  const int samples(static_cast<int>(std::min(
      1024ll * 1024, static_cast<long long>(std::round(
                         1 / std::sqrt(std::numeric_limits<result_type>::epsilon()))))));
  const result_type x_min{d.icdf(result_type(1) / result_type(100))};
  const result_type x_max{d.icdf(result_type(99) / result_type(100))};
  const result_type dx{(x_max - x_min) / samples};
  std::vector<result_type> y;
  for (int i{0}; i <= samples; ++i)
    y.push_back(d.pdf(x_min + i * dx));
  const result_type s{simpson_int(y.begin(), y.end()) * dx};
  const result_type tol{result_type(64) / result_type(samples) / result_type(samples)};
  REQUIRE(std::abs(s - result_type(98) / result_type(100)) < tol);
}